

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tracker_connection.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::http_tracker_connection::on_filter_hostname
          (http_tracker_connection *this,http_connection *param_1,string_view hostname)

{
  session_settings *psVar1;
  _WordT _Var2;
  bool bVar3;
  char *extraout_RDX;
  string_view hostname_00;
  unique_lock<std::mutex> local_38;
  
  psVar1 = ((this->super_tracker_connection).m_man)->m_settings;
  local_38._M_device = &psVar1->m_mutex;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  _Var2 = (psVar1->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  bVar3 = true;
  if (((uint)_Var2 >> 0x11 & 1) == 0) {
    hostname_00._M_str = extraout_RDX;
    hostname_00._M_len = (size_t)hostname._M_str;
    bVar3 = is_idna((aux *)hostname._M_len,hostname_00);
    bVar3 = !bVar3;
  }
  return bVar3;
}

Assistant:

bool http_tracker_connection::on_filter_hostname(aux::http_connection&
		, string_view hostname)
	{
		aux::session_settings const& settings = m_man.settings();
		if (settings.get_bool(settings_pack::allow_idna)) return true;
		return !is_idna(hostname);
	}